

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O3

Block * __thiscall
wasm::I64ToI32Lowering::lowerSub
          (I64ToI32Lowering *this,Block *result,TempVar *leftLow,TempVar *leftHigh,TempVar *rightLow
          ,TempVar *rightHigh)

{
  Index IVar1;
  undefined4 uVar2;
  Index IVar3;
  Builder *pBVar4;
  Expression *pEVar5;
  Expression *pEVar6;
  Binary *pBVar7;
  LocalSet *append;
  LocalSet *args;
  LocalSet *pLVar8;
  LocalGet *args_3;
  Block *pBVar9;
  Block *local_d8;
  undefined1 local_d0 [8];
  TempVar lowResult;
  TempVar borrow;
  undefined1 local_70 [8];
  TempVar highResult;
  
  getTemp((TempVar *)local_d0,this,(Type)0x2);
  getTemp((TempVar *)local_70,this,(Type)0x2);
  getTemp((TempVar *)&lowResult.ty,this,(Type)0x2);
  uVar2 = local_d0._0_4_;
  if ((char)lowResult.pass != '\x01') {
    if (leftLow->moved != true) {
      pBVar4 = (this->builder)._M_t.
               super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
               super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
      IVar1 = leftLow->idx;
      highResult.ty.id = (uintptr_t)leftLow;
      pEVar5 = (Expression *)MixedArena::allocSpace(&pBVar4->wasm->allocator,0x18,8);
      pEVar5->_id = LocalGetId;
      *(Index *)(pEVar5 + 1) = IVar1;
      (pEVar5->type).id = 2;
      if (rightLow->moved != true) {
        IVar1 = rightLow->idx;
        pEVar6 = (Expression *)
                 MixedArena::allocSpace
                           (&((this->builder)._M_t.
                              super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                              .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl)->wasm->
                             allocator,0x18,8);
        pEVar6->_id = LocalGetId;
        *(Index *)(pEVar6 + 1) = IVar1;
        (pEVar6->type).id = 2;
        pBVar7 = (Binary *)MixedArena::allocSpace(&pBVar4->wasm->allocator,0x28,8);
        (pBVar7->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId
        ;
        (pBVar7->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
        pBVar7->op = SubInt32;
        pBVar7->left = pEVar5;
        pBVar7->right = pEVar6;
        Binary::finalize(pBVar7);
        append = Builder::makeLocalSet(pBVar4,uVar2,(Expression *)pBVar7);
        IVar1 = (Index)lowResult.ty.id;
        if ((char)borrow.pass != '\x01') {
          if (*(char *)(highResult.ty.id + 0x10) != '\x01') {
            pBVar4 = (this->builder)._M_t.
                     super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
                     super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                     super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
            uVar2 = *(undefined4 *)highResult.ty.id;
            pEVar5 = (Expression *)MixedArena::allocSpace(&pBVar4->wasm->allocator,0x18,8);
            pEVar5->_id = LocalGetId;
            *(undefined4 *)(pEVar5 + 1) = uVar2;
            (pEVar5->type).id = 2;
            if (rightLow->moved != true) {
              IVar3 = rightLow->idx;
              pEVar6 = (Expression *)
                       MixedArena::allocSpace
                                 (&((this->builder)._M_t.
                                    super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                                    .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl)->
                                   wasm->allocator,0x18,8);
              pEVar6->_id = LocalGetId;
              *(Index *)(pEVar6 + 1) = IVar3;
              (pEVar6->type).id = 2;
              pBVar7 = (Binary *)MixedArena::allocSpace(&pBVar4->wasm->allocator,0x28,8);
              (pBVar7->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id =
                   BinaryId;
              (pBVar7->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id
                   = 0;
              pBVar7->op = LtUInt32;
              pBVar7->left = pEVar5;
              pBVar7->right = pEVar6;
              Binary::finalize(pBVar7);
              args = Builder::makeLocalSet(pBVar4,IVar1,(Expression *)pBVar7);
              uVar2 = local_70._0_4_;
              if ((char)highResult.pass != '\x01') {
                if ((char)borrow.pass != '\x01') {
                  pBVar4 = (this->builder)._M_t.
                           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                           .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
                  pEVar5 = (Expression *)MixedArena::allocSpace(&pBVar4->wasm->allocator,0x18,8);
                  pEVar5->_id = LocalGetId;
                  *(Index *)(pEVar5 + 1) = (Index)lowResult.ty.id;
                  (pEVar5->type).id = 2;
                  if (rightHigh->moved != true) {
                    IVar1 = rightHigh->idx;
                    pEVar6 = (Expression *)
                             MixedArena::allocSpace
                                       (&((this->builder)._M_t.
                                          super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                                          .super__Head_base<0UL,_wasm::Builder_*,_false>.
                                         _M_head_impl)->wasm->allocator,0x18,8);
                    pEVar6->_id = LocalGetId;
                    *(Index *)(pEVar6 + 1) = IVar1;
                    (pEVar6->type).id = 2;
                    pBVar7 = (Binary *)MixedArena::allocSpace(&pBVar4->wasm->allocator,0x28,8);
                    (pBVar7->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.
                    _id = BinaryId;
                    (pBVar7->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.
                    type.id = 0;
                    pBVar7->op = AddInt32;
                    pBVar7->left = pEVar5;
                    pBVar7->right = pEVar6;
                    Binary::finalize(pBVar7);
                    pLVar8 = Builder::makeLocalSet(pBVar4,uVar2,(Expression *)pBVar7);
                    uVar2 = local_70._0_4_;
                    if ((char)highResult.pass != '\x01') {
                      highResult.ty.id = (uintptr_t)pLVar8;
                      if (leftHigh->moved != true) {
                        pBVar4 = (this->builder)._M_t.
                                 super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                                 .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
                        IVar1 = leftHigh->idx;
                        pEVar5 = (Expression *)
                                 MixedArena::allocSpace(&pBVar4->wasm->allocator,0x18,8);
                        pEVar5->_id = LocalGetId;
                        *(Index *)(pEVar5 + 1) = IVar1;
                        (pEVar5->type).id = 2;
                        if ((char)highResult.pass != '\x01') {
                          pEVar6 = (Expression *)
                                   MixedArena::allocSpace
                                             (&((this->builder)._M_t.
                                                super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                                                .super__Head_base<0UL,_wasm::Builder_*,_false>.
                                               _M_head_impl)->wasm->allocator,0x18,8);
                          pEVar6->_id = LocalGetId;
                          *(undefined4 *)(pEVar6 + 1) = local_70._0_4_;
                          (pEVar6->type).id = 2;
                          pBVar7 = (Binary *)MixedArena::allocSpace(&pBVar4->wasm->allocator,0x28,8)
                          ;
                          (pBVar7->super_SpecificExpression<(wasm::Expression::Id)16>).
                          super_Expression._id = BinaryId;
                          (pBVar7->super_SpecificExpression<(wasm::Expression::Id)16>).
                          super_Expression.type.id = 0;
                          pBVar7->op = SubInt32;
                          pBVar7->left = pEVar5;
                          pBVar7->right = pEVar6;
                          Binary::finalize(pBVar7);
                          pLVar8 = Builder::makeLocalSet(pBVar4,uVar2,(Expression *)pBVar7);
                          if ((char)lowResult.pass != '\x01') {
                            args_3 = (LocalGet *)
                                     MixedArena::allocSpace
                                               (&((this->builder)._M_t.
                                                  super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                                                  .super__Head_base<0UL,_wasm::Builder_*,_false>.
                                                 _M_head_impl)->wasm->allocator,0x18,8);
                            (args_3->super_SpecificExpression<(wasm::Expression::Id)8>).
                            super_Expression._id = LocalGetId;
                            args_3->index = local_d0._0_4_;
                            (args_3->super_SpecificExpression<(wasm::Expression::Id)8>).
                            super_Expression.type.id = 2;
                            pBVar9 = Builder::
                                     blockify<wasm::LocalSet*,wasm::LocalSet*,wasm::LocalSet*,wasm::LocalGet*>
                                               ((this->builder)._M_t.
                                                super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                                                .super__Head_base<0UL,_wasm::Builder_*,_false>.
                                                _M_head_impl,(Expression *)result,
                                                (Expression *)append,args,
                                                (LocalSet *)highResult.ty.id,pLVar8,args_3);
                            local_d8 = pBVar9;
                            std::
                            _Hashtable<wasm::Expression*,std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>,std::allocator<std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>>,std::__detail::_Select1st,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                            ::_M_emplace<wasm::Expression*&,wasm::I64ToI32Lowering::TempVar>
                                      ((_Hashtable<wasm::Expression*,std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>,std::allocator<std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>>,std::__detail::_Select1st,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                                        *)&this->highBitVars,&local_d8,local_70);
                            TempVar::~TempVar((TempVar *)&lowResult.ty);
                            TempVar::~TempVar((TempVar *)local_70);
                            TempVar::~TempVar((TempVar *)local_d0);
                            return pBVar9;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  __assert_fail("!moved",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                ,0x4f,"Index wasm::I64ToI32Lowering::TempVar::operator unsigned int()");
}

Assistant:

Block* lowerSub(Block* result,
                  TempVar&& leftLow,
                  TempVar&& leftHigh,
                  TempVar&& rightLow,
                  TempVar&& rightHigh) {
    TempVar lowResult = getTemp();
    TempVar highResult = getTemp();
    TempVar borrow = getTemp();
    LocalSet* subLow = builder->makeLocalSet(
      lowResult,
      builder->makeBinary(SubInt32,
                          builder->makeLocalGet(leftLow, Type::i32),
                          builder->makeLocalGet(rightLow, Type::i32)));
    LocalSet* borrowBit = builder->makeLocalSet(
      borrow,
      builder->makeBinary(LtUInt32,
                          builder->makeLocalGet(leftLow, Type::i32),
                          builder->makeLocalGet(rightLow, Type::i32)));
    LocalSet* subHigh1 = builder->makeLocalSet(
      highResult,
      builder->makeBinary(AddInt32,
                          builder->makeLocalGet(borrow, Type::i32),
                          builder->makeLocalGet(rightHigh, Type::i32)));
    LocalSet* subHigh2 = builder->makeLocalSet(
      highResult,
      builder->makeBinary(SubInt32,
                          builder->makeLocalGet(leftHigh, Type::i32),
                          builder->makeLocalGet(highResult, Type::i32)));
    LocalGet* getLow = builder->makeLocalGet(lowResult, Type::i32);
    result =
      builder->blockify(result, subLow, borrowBit, subHigh1, subHigh2, getLow);
    setOutParam(result, std::move(highResult));
    return result;
  }